

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

void * IsoSpec::quickselect(void **array,int n,int start,int end)

{
  long lVar1;
  double dVar2;
  result_type_conflict rVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  int iVar9;
  
  iVar6 = start;
  if (start != end) {
    while( true ) {
      iVar9 = end;
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&random_gen);
      uVar5 = rVar3 % (ulong)(long)(iVar9 - iVar6);
      lVar4 = (long)iVar6;
      pdVar7 = (double *)array[uVar5 + lVar4];
      dVar2 = *pdVar7;
      lVar8 = (long)iVar9;
      lVar1 = lVar8 + -1;
      array[uVar5 + lVar4] = array[lVar8 + -1];
      array[lVar8 + -1] = pdVar7;
      end = iVar6;
      if (iVar6 < iVar9 + -1) {
        do {
          pdVar7 = (double *)array[lVar4];
          if (*pdVar7 <= dVar2 && dVar2 != *pdVar7) {
            array[lVar4] = array[end];
            array[end] = pdVar7;
            end = end + 1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        pdVar7 = (double *)array[lVar1];
        lVar4 = (long)end;
      }
      array[lVar1] = array[lVar4];
      array[lVar4] = pdVar7;
      start = n;
      if (end == n) break;
      if (end <= n) {
        iVar6 = end + 1;
        end = iVar9;
      }
    }
  }
  return array[start];
}

Assistant:

void* quickselect(void ** array, int n, int start, int end)
{
    if(start == end)
        return array[start];

    while(true)
    {
        // Partition part
        int len = end - start;
#if ISOSPEC_BUILDING_R
        int pivot = len/2 + start;
#else
        size_t pivot = random_gen() % len + start;  // Using Mersenne twister directly - we don't
                                                    // need a very uniform distribution just for pivot
                                                    // selection
#endif
        void* pval = array[pivot];
        double pprob = getLProb(pval);
        std::swap(array[pivot], array[end-1]);
        int loweridx = start;
        for(int i = start; i < end-1; i++)
        {
            if(getLProb(array[i]) < pprob)
            {
                std::swap(array[i], array[loweridx]);
                loweridx++;
            }
        }
        std::swap(array[end-1], array[loweridx]);

        // Selection part
        if(n == loweridx)
            return array[n];
        if(n < loweridx)
            end = loweridx;
        else
            start = loweridx+1;
    };
}